

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugLocateItemOnHover(ImGuiID target_id)

{
  bool bVar1;
  ImGuiID in_EDI;
  float in_stack_00000020;
  ImDrawFlags in_stack_00000024;
  float in_stack_00000028;
  ImU32 in_stack_0000002c;
  ImVec2 *in_stack_00000030;
  ImVec2 *in_stack_00000038;
  ImDrawList *in_stack_00000040;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff98;
  ImGuiHoveredFlags in_stack_ffffffffffffffb0;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiContext *local_10;
  ImGuiID local_4;
  
  if ((in_EDI != 0) && (local_4 = in_EDI, bVar1 = IsItemHovered(in_stack_ffffffffffffffb0), bVar1))
  {
    local_10 = GImGui;
    DebugLocateItem(local_4);
    GetForegroundDrawList((ImGuiWindow *)0x4d7cd8);
    ImVec2::ImVec2(&local_20,3.0,3.0);
    local_18 = ::operator-(in_stack_ffffffffffffff98,(ImVec2 *)0x4d7d1c);
    ImVec2::ImVec2(&local_30,3.0,3.0);
    local_28 = ::operator+(in_stack_ffffffffffffff98,(ImVec2 *)0x4d7d59);
    ImDrawList::AddRect(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c,
                        in_stack_00000028,in_stack_00000024,in_stack_00000020);
  }
  return;
}

Assistant:

void ImGui::DebugLocateItemOnHover(ImGuiID target_id)
{
    if (target_id == 0 || !IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem | ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        return;
    ImGuiContext& g = *GImGui;
    DebugLocateItem(target_id);
    GetForegroundDrawList(g.CurrentWindow)->AddRect(g.LastItemData.Rect.Min - ImVec2(3.0f, 3.0f), g.LastItemData.Rect.Max + ImVec2(3.0f, 3.0f), DEBUG_LOCATE_ITEM_COLOR);
}